

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(lvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_array_expression_t *expr)

{
  expression_type_t eVar1;
  uint uVar2;
  int iVar3;
  typed_var_expression_t *ptVar4;
  typed_expression_t *ptVar5;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> *this_00;
  rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
  rvalue_expression_compiler;
  ulong local_58;
  undefined **local_50;
  vector<long,_std::allocator<long>_> *local_48;
  string local_40;
  
  eVar1 = (expr->super_typed_lvalue_expression_t).super_typed_expression_t._type;
  if ((EXPR_TYPE_CLKLVALUE < eVar1) ||
     ((0x4c0U >> (eVar1 & (EXPR_TYPE_CONJUNCTIVE_FORMULA|EXPR_TYPE_CLKCONSTR_DIAGONAL)) & 1) == 0))
  {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"a lvalue",(allocator<char> *)&local_50);
    invalid_expression(this,(typed_expression_t *)expr,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  ptVar4 = typed_array_expression_t::variable(expr);
  uVar2 = ptVar4->_id;
  ptVar4 = typed_array_expression_t::variable(expr);
  iVar3 = (**(code **)(*(long *)&(ptVar4->super_typed_lvalue_expression_t).super_typed_expression_t
                      + 0x38))(ptVar4);
  local_48 = (this->_bytecode_back_inserter).container;
  this_00 = &this->_bytecode_back_inserter;
  local_50 = &PTR__typed_expression_visitor_t_0028ea28;
  local_58 = 5;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  local_58 = (ulong)uVar2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  ptVar5 = typed_array_expression_t::offset(expr);
  (**(code **)(*(long *)ptVar5 + 0x30))(ptVar5,&local_50);
  local_58 = 2;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  local_58 = 0;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  local_58 = (ulong)(iVar3 - 1);
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  local_58 = 0x13;
  std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>::operator=
            (this_00,(value_type_conflict3 *)&local_58);
  return;
}

Assistant:

virtual void visit(tchecker::typed_array_expression_t const & expr)
  {
    if ((expr.type() != tchecker::EXPR_TYPE_CLKLVALUE) && (expr.type() != tchecker::EXPR_TYPE_INTLVALUE) &&
        (expr.type() != tchecker::EXPR_TYPE_LOCALINTLVALUE))
      invalid_expression(expr, "a lvalue");

    // offset bounds
    auto const id = expr.variable().id();
    auto const lowoffset = 0;
    auto const highoffset = expr.variable().size() - 1;

    // Write bytecode
    tchecker::details::rvalue_expression_compiler_t<BYTECODE_BACK_INSERTER> rvalue_expression_compiler(_bytecode_back_inserter);

    _bytecode_back_inserter = tchecker::VM_PUSH;
    _bytecode_back_inserter = id;
    expr.offset().visit(rvalue_expression_compiler);
    _bytecode_back_inserter = tchecker::VM_FAILNOTIN;
    _bytecode_back_inserter = lowoffset;
    _bytecode_back_inserter = highoffset;
    _bytecode_back_inserter = tchecker::VM_SUM;
  }